

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_server.hpp
# Opt level: O2

string * __thiscall
cinatra::coro_http_server::build_range_header_abi_cxx11_
          (string *__return_storage_ptr__,coro_http_server *this,string_view mime,
          string_view filename,string_view file_size_str,int status,string_view content_range)

{
  _If_sv<std::basic_string_view<char>,_basic_string<char>_&> pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  string local_38;
  
  local_58._M_str = filename._M_str;
  local_58._M_len = filename._M_len;
  local_48._M_str = mime._M_str;
  local_48._M_len = mime._M_len;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"HTTP/1.1 ",(allocator<char> *)&local_38);
  std::__cxx11::to_string(&local_38,status);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,
             " OK\r\nAccess-Control-Allow-origin: *\r\nAccept-Ranges: bytes\r\n");
  if (content_range._M_len != 0) {
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)__return_storage_ptr__,&content_range);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,"Content-Disposition: attachment;filename=");
  pbVar1 = std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                     ((string *)__return_storage_ptr__,&local_58);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (pbVar1,"\r\n");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,"Connection: keep-alive\r\n");
  this_00 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (__return_storage_ptr__,"Content-Type: ");
  pbVar1 = std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                     ((string *)this_00,&local_48);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (pbVar1,"\r\n");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,"Content-Length: ");
  pbVar1 = std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                     ((string *)__return_storage_ptr__,&file_size_str);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (pbVar1,"\r\n\r\n");
  return __return_storage_ptr__;
}

Assistant:

std::string build_range_header(std::string_view mime,
                                 std::string_view filename,
                                 std::string_view file_size_str,
                                 int status = 200,
                                 std::string_view content_range = "") {
    std::string header_str = "HTTP/1.1 ";
    header_str.append(std::to_string(status));
    header_str.append(
        " OK\r\nAccess-Control-Allow-origin: "
        "*\r\nAccept-Ranges: bytes\r\n");
    if (!content_range.empty()) {
      header_str.append(content_range);
    }
    header_str.append("Content-Disposition: attachment;filename=");
    header_str.append(filename).append("\r\n");
    header_str.append("Connection: keep-alive\r\n");
    header_str.append("Content-Type: ").append(mime).append("\r\n");
    header_str.append("Content-Length: ");
    header_str.append(file_size_str).append("\r\n\r\n");
    return header_str;
  }